

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O0

void secp256k1_sha256_write(secp256k1_sha256 *hash,uchar *data,size_t len)

{
  size_t __n;
  size_t in_RDX;
  void *in_RSI;
  long in_RDI;
  size_t chunk_len;
  size_t bufsize;
  uint32_t *in_stack_000001b0;
  uint32_t *in_stack_000001b8;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_20 = *(ulong *)(in_RDI + 0x60);
  *(size_t *)(in_RDI + 0x60) = in_RDX + *(long *)(in_RDI + 0x60);
  local_20 = local_20 & 0x3f;
  local_18 = in_RDX;
  local_10 = in_RSI;
  while (0x3f < local_20 + local_18) {
    __n = 0x40 - local_20;
    memcpy((void *)(in_RDI + 0x20 + local_20),local_10,__n);
    local_10 = (void *)(__n + (long)local_10);
    local_18 = local_18 - __n;
    secp256k1_sha256_transform(in_stack_000001b8,in_stack_000001b0);
    local_20 = 0;
  }
  if (local_18 != 0) {
    memcpy((void *)(in_RDI + 0x20 + local_20),local_10,local_18);
  }
  return;
}

Assistant:

static void secp256k1_sha256_write(secp256k1_sha256 *hash, const unsigned char *data, size_t len) {
    size_t bufsize = hash->bytes & 0x3F;
    hash->bytes += len;
    while (bufsize + len >= 64) {
        /* Fill the buffer, and process it. */
        size_t chunk_len = 64 - bufsize;
        memcpy(((unsigned char*)hash->buf) + bufsize, data, chunk_len);
        data += chunk_len;
        len -= chunk_len;
        secp256k1_sha256_transform(hash->s, hash->buf);
        bufsize = 0;
    }
    if (len) {
        /* Fill the buffer with what remains. */
        memcpy(((unsigned char*)hash->buf) + bufsize, data, len);
    }
}